

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O2

string * (anonymous_namespace)::get_name_abi_cxx11_(pbf_reader layer)

{
  bool bVar1;
  string *in_RDI;
  StringRef local_98;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  SourceLineInfo local_30;
  
  bVar1 = protozero::pbf_reader::next(&layer,1);
  if (bVar1) {
    protozero::pbf_reader::get_string_abi_cxx11_(in_RDI,&layer);
  }
  else {
    local_98.m_start = "REQUIRE";
    local_98.m_size = 7;
    local_30.file =
         "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/vector_tile/reader_test_cases.cpp"
    ;
    local_30.line = 0x10;
    Catch::StringRef::StringRef(&local_40,"false");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,&local_98,&local_30,local_40,Normal);
    local_98.m_start = (char *)((ulong)local_98.m_start & 0xffffffffffffff00);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_98);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&catchAssertionHandler);
  }
  return in_RDI;
}

Assistant:

std::string get_name(protozero::pbf_reader layer) { // copy!
    while (layer.next(1)) { // required string name
        return layer.get_string();
    }
    REQUIRE(false); // should never be here
    return "";
}